

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall TextReaderTest_ReadInt_Test::TestBody(TextReaderTest_ReadInt_Test *this)

{
  NLStringRef data;
  bool bVar1;
  undefined1 uVar2;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  TextReader reader;
  char *in_stack_fffffffffffffe48;
  TextReader<fmt::Locale> *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  TextReader<fmt::Locale> *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  char *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  Type in_stack_fffffffffffffe7c;
  CStringRef in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  Message *in_stack_fffffffffffffec8;
  AssertHelper *in_stack_fffffffffffffed0;
  undefined1 local_111 [33];
  AssertionResult local_f0 [2];
  long local_d0;
  undefined4 local_c4;
  AssertionResult local_c0 [3];
  int local_90;
  undefined4 local_8c;
  AssertionResult local_88;
  BasicCStringRef<char> local_78 [15];
  
  mp::NLStringRef::NLStringRef((NLStringRef *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_78,"test");
  data.data_._7_1_ = in_stack_fffffffffffffe8f;
  data.data_._0_7_ = in_stack_fffffffffffffe88;
  data.size_ = (size_t)in_stack_fffffffffffffe90;
  mp::internal::TextReader<fmt::Locale>::TextReader
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),data,
             in_stack_fffffffffffffe80);
  local_8c = 0xb;
  local_90 = mp::internal::TextReader<fmt::Locale>::ReadInt<int>(in_stack_fffffffffffffe60);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (int *)in_stack_fffffffffffffe50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80.data_);
    testing::AssertionResult::failure_message((AssertionResult *)0x13caa4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe80.data_,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
    testing::Message::~Message((Message *)0x13cb01);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13cb59);
  local_c4 = 0xffffffea;
  local_d0 = mp::internal::TextReader<fmt::Locale>::ReadInt<long>(in_stack_fffffffffffffe60);
  testing::internal::EqHelper<false>::Compare<int,long>
            ((char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
             (char *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
             (long *)in_stack_fffffffffffffe50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe80.data_);
    in_stack_fffffffffffffe90 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x13cc1b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe80.data_,in_stack_fffffffffffffe7c,
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60
              );
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
    testing::Message::~Message((Message *)0x13cc78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ccd0);
  testing::AssertionSuccess();
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_f0);
  if ((bool)uVar2) {
    in_stack_fffffffffffffe80.data_ = local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe88),
               (allocator<char> *)in_stack_fffffffffffffe80.data_);
    std::allocator<char>::~allocator((allocator<char> *)local_111);
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffe7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadInt<int>(in_stack_fffffffffffffe60);
    }
    testing::AssertionResult::operator<<
              ((AssertionResult *)in_stack_fffffffffffffe80.data_,
               (char (*) [104])CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::__cxx11::string::~string((string *)(local_111 + 1));
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffe80.data_);
  testing::AssertionResult::failure_message((AssertionResult *)0x13d02f);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe80.data_,in_stack_fffffffffffffe7c,
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,(char *)in_stack_fffffffffffffe60);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe50);
  testing::Message::~Message((Message *)0x13d08a);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13d0df);
  mp::internal::TextReader<fmt::Locale>::~TextReader(in_stack_fffffffffffffe50);
  return;
}

Assistant:

TEST(TextReaderTest, ReadInt) {
  TextReader reader("  11   -22 ", "test");
  EXPECT_EQ(11, reader.ReadInt<int>());
  EXPECT_EQ(-22, reader.ReadInt<long>());
  EXPECT_THROW_MSG(reader.ReadInt<int>(), mp::ReadError,
                   "test:1:12: expected integer");
}